

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void array_define_save(t_gobj *z,_binbuf *bb)

{
  _glist *p_Var1;
  t_symbol *ptVar2;
  
  if (z[3].g_pd == (t_pd)0x0) {
    p_Var1 = (_glist *)0x0;
  }
  else {
    p_Var1 = pd_checkglist((t_pd *)z[3].g_pd);
  }
  ptVar2 = gensym("obj");
  binbuf_addv(bb,"ssff",(double)(int)*(short *)&z[2].g_next,
              (double)(int)*(short *)((long)&z[2].g_next + 2),&s__X,ptVar2);
  binbuf_addbinbuf(bb,(_binbuf *)z[1].g_pd);
  binbuf_addsemi(bb);
  if (p_Var1 != (_glist *)0x0) {
    garray_savecontentsto((_garray *)p_Var1->gl_list,bb);
    obj_saveformat((t_object *)z,bb);
    return;
  }
  bug("array_define_save");
  return;
}

Assistant:

void array_define_save(t_gobj *z, t_binbuf *bb)
{
    t_glist *x = (t_glist *)z;
    t_glist *gl = (x->gl_list ? pd_checkglist(&x->gl_list->g_pd) : 0);
    binbuf_addv(bb, "ssff", &s__X, gensym("obj"),
        (t_float)x->gl_obj.te_xpix, (t_float)x->gl_obj.te_ypix);
    binbuf_addbinbuf(bb, x->gl_obj.ob_binbuf);
    binbuf_addsemi(bb);

    if (gl)
    {
        garray_savecontentsto((t_garray *)gl->gl_list, bb);
        obj_saveformat(&x->gl_obj, bb);
    }
    else
        bug("array_define_save");
}